

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

char * leveldb::GetVarint32PtrFallback(char *p,char *limit,uint32_t *value)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  char *in_R9;
  long in_FS_OFFSET;
  bool bVar8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (char *)0x0;
  pcVar4 = pcVar3;
  if (p < limit) {
    uVar5 = 0;
    uVar7 = 0;
    pcVar6 = p + 1;
    do {
      bVar1 = pcVar6[-1];
      if ((char)bVar1 < '\0') {
        uVar7 = uVar7 | (bVar1 & 0x7f) << ((byte)uVar5 & 0x1f);
      }
      else {
        uVar7 = uVar7 | (uint)bVar1 << ((byte)uVar5 & 0x1f);
        *value = uVar7;
        in_R9 = pcVar6;
      }
      pcVar4 = in_R9;
      if ((-1 < (char)bVar1) || (pcVar4 = pcVar3, 0x15 < uVar5)) break;
      uVar5 = uVar5 + 7;
      bVar8 = pcVar6 < limit;
      pcVar6 = pcVar6 + 1;
    } while (bVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return pcVar4;
}

Assistant:

const char* GetVarint32PtrFallback(const char* p, const char* limit,
                                   uint32_t* value) {
  uint32_t result = 0;
  for (uint32_t shift = 0; shift <= 28 && p < limit; shift += 7) {
    uint32_t byte = *(reinterpret_cast<const uint8_t*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}